

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int bid_keycmp(char *p,char *key,ssize_t len)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  
  if (len < 1) {
    len = 0;
    pbVar4 = (byte *)p;
    pcVar6 = key;
  }
  else {
    pbVar4 = (byte *)(p + len);
    pcVar6 = key + len;
    lVar8 = len + 1;
    uVar7 = 0;
    pbVar3 = (byte *)p;
    pcVar5 = key;
    do {
      if (p[uVar7] == '\0') {
        pcVar5 = key + uVar7;
        pbVar3 = (byte *)(p + uVar7);
LAB_004f275d:
        len = uVar7 & 0xffffffff;
        pbVar4 = pbVar3;
        pcVar6 = pcVar5;
        break;
      }
      if (key[uVar7] == '\0') goto LAB_004f275d;
      if (p[uVar7] != key[uVar7]) {
        return 0;
      }
      pbVar3 = pbVar3 + 1;
      pcVar5 = pcVar5 + 1;
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + -1;
    } while (1 < lVar8);
  }
  iVar2 = (int)len;
  if (*pcVar6 == '\0') {
    bVar1 = *pbVar4;
    if (((ulong)bVar1 < 0x3e) && ((0x2000000100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
      return iVar2;
    }
    if (bVar1 == 0x5c) {
      if (pbVar4[1] == 10) {
        return iVar2;
      }
      if (pbVar4[1] == 0xd) {
        return iVar2;
      }
    }
  }
  return 0;
}

Assistant:

static int
bid_keycmp(const char *p, const char *key, ssize_t len)
{
	int match_len = 0;

	while (len > 0 && *p && *key) {
		if (*p == *key) {
			--len;
			++p;
			++key;
			++match_len;
			continue;
		}
		return (0);/* Not match */
	}
	if (*key != '\0')
		return (0);/* Not match */

	/* A following character should be specified characters */
	if (p[0] == '=' || p[0] == ' ' || p[0] == '\t' ||
	    p[0] == '\n' || p[0] == '\r' ||
	   (p[0] == '\\' && (p[1] == '\n' || p[1] == '\r')))
		return (match_len);
	return (0);/* Not match */
}